

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materialized_query_result.cpp
# Opt level: O2

Value * __thiscall
duckdb::MaterializedQueryResult::GetValue
          (Value *__return_storage_ptr__,MaterializedQueryResult *this,idx_t column,idx_t index)

{
  _Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false> __p;
  pointer this_00;
  pointer this_01;
  _Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false> local_e0;
  ColumnDataRowCollection local_d8;
  
  if ((this->row_collection).
      super_unique_ptr<duckdb::ColumnDataRowCollection,_std::default_delete<duckdb::ColumnDataRowCollection>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::ColumnDataRowCollection,_std::default_delete<duckdb::ColumnDataRowCollection>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ColumnDataRowCollection_*,_std::default_delete<duckdb::ColumnDataRowCollection>_>
      .super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>._M_head_impl ==
      (ColumnDataRowCollection *)0x0) {
    this_00 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
              ::operator->(&this->collection);
    ColumnDataCollection::GetRows(&local_d8,this_00);
    make_uniq<duckdb::ColumnDataRowCollection,duckdb::ColumnDataRowCollection>
              ((duckdb *)&local_e0,&local_d8);
    __p._M_head_impl = local_e0._M_head_impl;
    local_e0._M_head_impl = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::ColumnDataRowCollection,_std::default_delete<duckdb::ColumnDataRowCollection>_>
    ::reset((__uniq_ptr_impl<duckdb::ColumnDataRowCollection,_std::default_delete<duckdb::ColumnDataRowCollection>_>
             *)&this->row_collection,__p._M_head_impl);
    ::std::
    unique_ptr<duckdb::ColumnDataRowCollection,_std::default_delete<duckdb::ColumnDataRowCollection>_>
    ::~unique_ptr((unique_ptr<duckdb::ColumnDataRowCollection,_std::default_delete<duckdb::ColumnDataRowCollection>_>
                   *)&local_e0);
    ColumnDataRowCollection::~ColumnDataRowCollection(&local_d8);
  }
  this_01 = unique_ptr<duckdb::ColumnDataRowCollection,_std::default_delete<duckdb::ColumnDataRowCollection>,_true>
            ::operator->(&this->row_collection);
  ColumnDataRowCollection::GetValue(__return_storage_ptr__,this_01,column,index);
  return __return_storage_ptr__;
}

Assistant:

Value MaterializedQueryResult::GetValue(idx_t column, idx_t index) {
	if (!row_collection) {
		row_collection = make_uniq<ColumnDataRowCollection>(collection->GetRows());
	}
	return row_collection->GetValue(column, index);
}